

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall QAbstractItemView::closePersistentEditor(QAbstractItemView *this,QModelIndex *index)

{
  QAbstractItemViewPrivate *this_00;
  Data *pDVar1;
  QWidget *pQVar2;
  bool bVar3;
  QEditorInfo *pQVar4;
  long in_FS_OFFSET;
  QModelIndex local_50;
  QWidget *editor;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  pQVar4 = QAbstractItemViewPrivate::editorForIndex(this_00,index);
  pDVar1 = (pQVar4->widget).wp.d;
  if ((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) {
    pQVar2 = (QWidget *)(pQVar4->widget).wp.value;
    editor = pQVar2;
    if (pQVar2 != (QWidget *)0x0) {
      selectionModel(this);
      QItemSelectionModel::currentIndex();
      bVar3 = ::comparesEqual(index,&local_50);
      if (bVar3) {
        (**(code **)(*(long *)this + 0x290))(this,pQVar2,4);
      }
      QHash<QWidget*,QHashDummyValue>::removeImpl<QWidget*>
                ((QHash<QWidget*,QHashDummyValue> *)&this_00->persistent,&editor);
      QAbstractItemViewPrivate::removeEditor(this_00,editor);
      QAbstractItemViewPrivate::releaseEditor(this_00,editor,index);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::closePersistentEditor(const QModelIndex &index)
{
    Q_D(QAbstractItemView);
    if (QWidget *editor = d->editorForIndex(index).widget.data()) {
        if (index == selectionModel()->currentIndex())
            closeEditor(editor, QAbstractItemDelegate::RevertModelCache);
        d->persistent.remove(editor);
        d->removeEditor(editor);
        d->releaseEditor(editor, index);
    }
}